

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_cut_border_3d
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int front,int behind,
               Option *opt)

{
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined8 in_stack_00000018;
  ParamDict pd;
  Layer *crop;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff8c;
  ParamDict *in_stack_ffffffffffffff90;
  ParamDict local_48;
  Layer *local_38;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  undefined8 local_20;
  long local_18;
  
  if (((*(int *)(in_RDI + 0x2c) < (int)(in_R8D + in_R9D)) ||
      (*(int *)(in_RDI + 0x30) < (int)(in_EDX + in_ECX))) ||
     (*(int *)(in_RDI + 0x34) < in_stack_00000008 + in_stack_00000010)) {
    fprintf(_stderr,
            "copy_cut_border_3d parameter error, top: %d, bottom: %d, left: %d, right: %d, front: %d, behind: %d, src.w: %d, src.h: %d, src.d: %d"
            ,(ulong)in_EDX,(ulong)in_ECX,(ulong)in_R8D,(ulong)in_R9D);
    fprintf(_stderr,"\n");
  }
  else {
    local_30 = in_R9D;
    local_2c = in_R8D;
    local_28 = in_ECX;
    local_24 = in_EDX;
    local_20 = in_RSI;
    local_18 = in_RDI;
    local_38 = create_layer(in_stack_ffffffffffffff8c);
    ParamDict::ParamDict(in_stack_ffffffffffffff90);
    ParamDict::set(&local_48,0,local_2c);
    ParamDict::set(&local_48,1,local_24);
    ParamDict::set(&local_48,0xd,in_stack_00000008);
    ParamDict::set(&local_48,2,0);
    ParamDict::set(&local_48,3,(*(int *)(local_18 + 0x2c) - local_2c) - local_30);
    ParamDict::set(&local_48,4,(*(int *)(local_18 + 0x30) - local_24) - local_28);
    ParamDict::set(&local_48,0xe,(*(int *)(local_18 + 0x34) - in_stack_00000008) - in_stack_00000010
                  );
    ParamDict::set(&local_48,5,-0xe9);
    (*local_38->_vptr_Layer[2])(local_38,&local_48);
    (*local_38->_vptr_Layer[4])(local_38,in_stack_00000018);
    (*local_38->_vptr_Layer[7])(local_38,local_18,local_20,in_stack_00000018);
    (*local_38->_vptr_Layer[5])(local_38,in_stack_00000018);
    if (local_38 != (Layer *)0x0) {
      (*local_38->_vptr_Layer[1])();
    }
    ParamDict::~ParamDict
              ((ParamDict *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  return;
}

Assistant:

void copy_cut_border_3d(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int front, int behind, const Option& opt)
{
    if (left + right > src.w || top + bottom > src.h || front + behind > src.d)
    {
        NCNN_LOGE("copy_cut_border_3d parameter error, top: %d, bottom: %d, left: %d, right: %d, front: %d, behind: %d, src.w: %d, src.h: %d, src.d: %d", top, bottom, left, right, front, behind, src.w, src.h, src.d);
        return;
    }
    Layer* crop = create_layer(LayerType::Crop);

    ParamDict pd;
    pd.set(0, left);
    pd.set(1, top);
    pd.set(13, front);
    pd.set(2, 0);
    pd.set(3, src.w - left - right);
    pd.set(4, src.h - top - bottom);
    pd.set(14, src.d - front - behind);
    pd.set(5, -233);

    crop->load_param(pd);

    crop->create_pipeline(opt);

    crop->forward(src, dst, opt);

    crop->destroy_pipeline(opt);

    delete crop;
}